

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

void slang::ast::SemanticFacts::populateTimeScale
               (TimeScale *timeScale,Scope *scope,optional<slang::TimeScale> directiveTimeScale,
               bool hasBase,bool hasPrecision)

{
  _Storage<slang::TimeScale,_true> _Var1;
  TimeScaleValue TVar2;
  
  TVar2 = directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload._0_2_;
  if (!hasBase || !hasPrecision) {
    if ((scope->thisSym->kind == CompilationUnit) &&
       (((uint5)directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale> & 0x100000000) != 0)) {
      _Var1 = directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale>._M_payload;
    }
    else {
      _Var1._M_value = Scope::getTimeScale(scope);
      TVar2 = _Var1._M_value.base;
    }
    if (!hasBase) {
      timeScale->base = TVar2;
    }
    if (!hasPrecision) {
      timeScale->precision = _Var1._M_value.precision;
    }
  }
  return;
}

Assistant:

void SemanticFacts::populateTimeScale(TimeScale& timeScale, const Scope& scope,
                                      std::optional<TimeScale> directiveTimeScale, bool hasBase,
                                      bool hasPrecision) {
    // If no time unit was set, infer one based on the following rules:
    // - If the scope is nested (inside another definition), inherit from that definition.
    // - Otherwise use a `timescale directive if there is one.
    // - Otherwise, look for a time unit in the compilation scope.
    // - Finally use the compilation default.
    if (hasBase && hasPrecision)
        return;

    std::optional<TimeScale> ts;
    if (scope.asSymbol().kind == SymbolKind::CompilationUnit)
        ts = directiveTimeScale;

    if (!ts)
        ts = scope.getTimeScale();

    if (!hasBase)
        timeScale.base = ts->base;
    if (!hasPrecision)
        timeScale.precision = ts->precision;

    // TODO: error if inferred timescale is invalid (because precision > units)
}